

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation.cpp
# Opt level: O2

bool __thiscall TxReconciliationTracker::Impl::IsPeerRegistered(Impl *this,NodeId peer_id)

{
  __node_ptr p_Var1;
  char *__c;
  long in_FS_OFFSET;
  bool bVar2;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock14;
  NodeId local_40;
  unique_lock<std::mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  __c = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/txreconciliation.cpp"
  ;
  bVar2 = false;
  local_40 = peer_id;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_38,&this->m_txreconciliation_mutex,
             "m_txreconciliation_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/txreconciliation.cpp"
             ,0x8c,false);
  p_Var1 = std::
           _Hashtable<long,_std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_std::allocator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_node(&(this->m_states)._M_h,
                          (ulong)peer_id % (this->m_states)._M_h._M_bucket_count,&local_40,
                          (__hash_code)__c);
  if (p_Var1 != (__node_ptr)0x0) {
    bVar2 = (p_Var1->
            super__Hash_node_value<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
            ).
            super__Hash_node_value_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>
            ._M_storage._M_storage.__data[0x20] == '\x01';
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_txreconciliation_mutex)
    {
        AssertLockNotHeld(m_txreconciliation_mutex);
        LOCK(m_txreconciliation_mutex);
        auto recon_state = m_states.find(peer_id);
        return (recon_state != m_states.end() &&
                std::holds_alternative<TxReconciliationState>(recon_state->second));
    }